

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chibicc_parse.c
# Opt level: O0

C_Type * union_decl(C_Parser *parser,C_Token **rest,C_Token *tok)

{
  int iVar1;
  C_Type *pCVar2;
  C_Member *local_38;
  C_Member *mem;
  C_Type *ty;
  C_Token *tok_local;
  C_Token **rest_local;
  C_Parser *parser_local;
  
  pCVar2 = struct_union_decl(parser,rest,tok);
  pCVar2->kind = TY_UNION;
  if (-1 < pCVar2->size) {
    for (local_38 = pCVar2->members; local_38 != (C_Member *)0x0; local_38 = local_38->next) {
      if (pCVar2->align < local_38->align) {
        pCVar2->align = local_38->align;
      }
      if (pCVar2->size < local_38->ty->size) {
        pCVar2->size = local_38->ty->size;
      }
    }
    iVar1 = C_align_to(pCVar2->size,pCVar2->align);
    pCVar2->size = iVar1;
  }
  return pCVar2;
}

Assistant:

static C_Type *union_decl(C_Parser *parser, C_Token **rest, C_Token *tok) {
  C_Type *ty = struct_union_decl(parser, rest, tok);
  ty->kind = TY_UNION;

  if (ty->size < 0)
    return ty;

  // If union, we don't have to assign offsets because they
  // are already initialized to zero. We need to compute the
  // alignment and the size though.
  for (C_Member *mem = ty->members; mem; mem = mem->next) {
    if (ty->align < mem->align)
      ty->align = mem->align;
    if (ty->size < mem->ty->size)
      ty->size = mem->ty->size;
  }
  ty->size = C_align_to(ty->size, ty->align);
  return ty;
}